

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateLookupByKey
          (KotlinKMPGenerator *this,FieldDef *key_field,StructDef *struct_def,CodeWriter *writer,
          IDLOptions *options)

{
  IDLOptions *writer_00;
  ostream *poVar1;
  function<void_()> local_2d0;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  allocator<char> local_249;
  string local_248;
  undefined1 local_228 [8];
  anon_class_32_4_5c0e32c5 statements;
  string local_1e8;
  stringstream local_1b8 [8];
  stringstream params;
  ostream local_1a8 [376];
  IDLOptions *local_30;
  IDLOptions *options_local;
  CodeWriter *writer_local;
  StructDef *struct_def_local;
  FieldDef *key_field_local;
  KotlinKMPGenerator *this_local;
  
  local_30 = options;
  options_local = (IDLOptions *)writer;
  writer_local = (CodeWriter *)struct_def;
  struct_def_local = (StructDef *)key_field;
  key_field_local = (FieldDef *)this;
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar1 = std::operator<<(local_1a8,"obj: ");
  IdlNamer::Type_abi_cxx11_(&local_1e8,&this->namer_,(StructDef *)writer_local);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e8);
  poVar1 = std::operator<<(poVar1,"?");
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::operator<<(local_1a8,"vectorLocation: Int, ");
  poVar1 = std::operator<<(local_1a8,"key: ");
  GenTypeGet_abi_cxx11_((string *)&statements.struct_def,this,(Type *)&struct_def_local->fields);
  poVar1 = std::operator<<(poVar1,(string *)&statements.struct_def);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string((string *)&statements.struct_def);
  std::operator<<(local_1a8,"bb: ReadWriteBuffer");
  writer_00 = options_local;
  local_228 = (undefined1  [8])&struct_def_local;
  statements.key_field = (FieldDef **)options_local;
  statements.this = (KotlinKMPGenerator *)writer_local;
  statements.writer = (CodeWriter *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"lookupByKey",&local_249);
  std::__cxx11::stringstream::str();
  IdlNamer::Type_abi_cxx11_(&local_2b0,&this->namer_,(StructDef *)writer_local);
  std::operator+(&local_290,&local_2b0,"?");
  std::function<void()>::
  function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateLookupByKey(flatbuffers::FieldDef*,flatbuffers::StructDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_&,void>
            ((function<void()> *)&local_2d0,(anon_class_32_4_5c0e32c5 *)local_228);
  GenerateFun((CodeWriter *)writer_00,&local_248,&local_270,&local_290,&local_2d0,
              (bool)(options->gen_jvmstatic & 1));
  std::function<void_()>::~function(&local_2d0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void GenerateLookupByKey(FieldDef *key_field, StructDef &struct_def,
                           CodeWriter &writer, const IDLOptions options) const {
    std::stringstream params;
    params << "obj: " << namer_.Type(struct_def) << "?"
           << ", ";
    params << "vectorLocation: Int, ";
    params << "key: " << GenTypeGet(key_field->value.type) << ", ";
    params << "bb: ReadWriteBuffer";

    auto statements = [&]() {
      auto base_type = key_field->value.type.base_type;
      writer.SetValue("struct_name", namer_.Type(struct_def));
      if (base_type == BASE_TYPE_STRING) {
        writer += "val byteKey = key.encodeToByteArray()";
      }
      writer += "var span = bb.getInt(vectorLocation - 4)";
      writer += "var start = 0";
      writer += "while (span != 0) {";
      writer.IncrementIdentLevel();
      writer += "var middle = span / 2";
      writer +=
          "val tableOffset = indirect(vector"
          "Location + 4 * (start + middle), bb)";
      if (IsString(key_field->value.type)) {
        writer += "val comp = compareStrings(\\";
        writer += GenOffsetGetter(key_field) + "\\";
        writer += ", byteKey, bb)";
      } else {
        auto get_val = GenLookupByKey(key_field, "bb");
        writer += "val value = " + get_val;
        writer += "val comp = value.compareTo(key)";
      }
      writer += "when {";
      writer.IncrementIdentLevel();
      writer += "comp > 0 -> span = middle";
      writer += "comp < 0 -> {";
      writer.IncrementIdentLevel();
      writer += "middle++";
      writer += "start += middle";
      writer += "span -= middle";
      writer.DecrementIdentLevel();
      writer += "}";  // end comp < 0
      writer += "else -> {";
      writer.IncrementIdentLevel();
      writer += "return (obj ?: {{struct_name}}()).init(tableOffset, bb)";
      writer.DecrementIdentLevel();
      writer += "}";  // end else
      writer.DecrementIdentLevel();
      writer += "}";  // end when
      writer.DecrementIdentLevel();
      writer += "}";  // end while
      writer += "return null";
    };
    GenerateFun(writer, "lookupByKey", params.str(),
                namer_.Type(struct_def) + "?", statements,
                options.gen_jvmstatic);
  }